

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::CreateBufferTexture<short,2,false>
          (BufferTest *this,bool use_range_version)

{
  GLuint *pGVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  char *pcVar5;
  ulong uVar6;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  GLint alignment;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x6f8))(1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x34c);
  (**(code **)(lVar4 + 0xb8))(0x8c2a,this->m_to);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x34f);
  pGVar1 = &this->m_bo;
  (**(code **)(lVar4 + 0x6c8))(1,pGVar1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateBuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x352);
  (**(code **)(lVar4 + 0x40))(0x8c2a,this->m_bo);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x355);
  if ((int)CONCAT71(in_register_00000031,use_range_version) == 0) {
    (**(code **)(lVar4 + 0x150))
              (0x8c2a,0x18,Reference::ReferenceData<short,_false>::reference,0x88e4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x36d);
    (**(code **)(lVar4 + 0x13d8))(this->m_to,0x8239,*pGVar1);
  }
  else {
    _alignment = (TestLog *)CONCAT44(uStack_1ac,1);
    (**(code **)(lVar4 + 0x868))(0x919f,&alignment);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x35d);
    uVar6 = (ulong)_alignment & 0xffffffff;
    (**(code **)(lVar4 + 0x150))(0x8c2a,alignment + 0x18,0,0x88e4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x363);
    (**(code **)(lVar4 + 0x168))
              (0x8c2a,uVar6,0x18,Reference::ReferenceData<short,_false>::reference);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBufferSubdata has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x366);
    (**(code **)(lVar4 + 0x13e0))(this->m_to,0x8239,*pGVar1,uVar6,0x18);
  }
  iVar2 = (**(code **)(lVar4 + 0x800))();
  if (iVar2 != 0) {
    _alignment = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    pcVar5 = "glTextureBuffer";
    if (use_range_version) {
      pcVar5 = "glTextureBufferRange";
    }
    std::operator<<((ostream *)local_1a8,pcVar5);
    std::operator<<((ostream *)local_1a8," unexpectedly generated error ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
    std::operator<<((ostream *)local_1a8," during test of internal format ");
    local_1d0.m_getName = glu::getTextureFormatName;
    local_1d0.m_value = 0x8239;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)local_1a8);
    std::operator<<((ostream *)local_1a8,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    CleanBufferTexture(this);
  }
  return iVar2 == 0;
}

Assistant:

bool BufferTest::CreateBufferTexture(bool use_range_version)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_BUFFER, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.genBuffers(1, &m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

	gl.bindBuffer(GL_TEXTURE_BUFFER, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

	/* Data setup. */
	if (use_range_version)
	{
		glw::GLint alignment = 1;

		gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &alignment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		const glw::GLuint b_offset = alignment;
		const glw::GLuint b_size   = TestReferenceDataSize<T, S>() + b_offset;

		gl.bufferData(GL_TEXTURE_BUFFER, b_size, NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData has failed");

		gl.bufferSubData(GL_TEXTURE_BUFFER, b_offset, TestReferenceDataSize<T, S>(), ReferenceData<T, N>());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubdata has failed");

		gl.textureBufferRange(m_to, InternalFormat<T, S, N>(), m_bo, b_offset, TestReferenceDataSize<T, S>());
	}
	else
	{
		gl.bufferData(GL_TEXTURE_BUFFER, TestReferenceDataSize<T, S>(), ReferenceData<T, N>(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		gl.textureBuffer(m_to, InternalFormat<T, S, N>(), m_bo);
	}

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << (use_range_version ? ("glTextureBufferRange") : ("glTextureBuffer"))
			<< " unexpectedly generated error " << glu::getErrorStr(error) << " during test of internal format "
			<< glu::getTextureFormatStr(InternalFormat<T, S, N>()) << "." << tcu::TestLog::EndMessage;

		CleanBufferTexture();

		return false;
	}

	return true;
}